

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Statement> __thiscall Parser::continueStatement(Parser *this)

{
  undefined8 this_00;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Parser *in_RSI;
  char *this_01;
  char *this_02;
  ptr<Statement> pVar4;
  ptr<Statement> pVar5;
  ptr<Statement> pVar6;
  undefined1 uStack_69;
  _Alloc_hider _Stack_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_58;
  
  if (in_RSI->functionCounter != 0) {
    consume(in_RSI);
    consume(in_RSI,StatEnd,"\';\'");
    puVar2 = (undefined8 *)operator_new(0x18);
    puVar2[1] = 0x100000001;
    *puVar2 = &PTR___Sp_counted_ptr_inplace_0012ee70;
    puVar2[2] = &PTR_execute_0012eec0;
    (this->filepath)._M_dataplus._M_p = (pointer)(puVar2 + 2);
    (this->filepath)._M_string_length = (size_type)puVar2;
    pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_execute_0012eec0;
    pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ptr<Statement>)pVar4.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = "Unexpected \'continue\' outside a function.";
  error(in_RSI,"Unexpected \'continue\' outside a function.");
  if (((Parser *)this_01)->functionCounter != 0) {
    consume((Parser *)this_01);
    consume((Parser *)this_01,StatEnd,"\';\'");
    puVar2 = (undefined8 *)operator_new(0x18);
    puVar2[1] = 0x100000001;
    *puVar2 = &PTR___Sp_counted_ptr_inplace_0012ef00;
    puVar2[2] = &PTR_execute_0012ef50;
    (in_RSI->filepath)._M_dataplus._M_p = (pointer)(puVar2 + 2);
    (in_RSI->filepath)._M_string_length = (size_type)puVar2;
    pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_execute_0012ef50;
    pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RSI;
    return (ptr<Statement>)pVar5.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_02 = "Unexpected \'continue\' outside a function.";
  error((Parser *)this_01,"Unexpected \'continue\' outside a function.");
  consume((Parser *)this_02);
  aStack_58._M_allocated_capacity = 0;
  aStack_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = match((Parser *)this_02,StatEnd);
  if (!bVar1) {
    expression((Parser *)&_Stack_68);
    this_00 = aStack_58._8_8_;
    aStack_58._8_8_ = _Stack_60._M_pi;
    aStack_58._M_allocated_capacity = (size_type)_Stack_68._M_p;
    _Stack_68._M_p = (pointer)0x0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
  }
  consume((Parser *)this_02,StatEnd,"\';\'");
  _Stack_68._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ThrowStatement,std::allocator<ThrowStatement>,std::shared_ptr<Expression>&>
            (&_Stack_60,(ThrowStatement **)&_Stack_68,(allocator<ThrowStatement> *)&uStack_69,
             (shared_ptr<Expression> *)&aStack_58);
  _Var3._M_pi = _Stack_60._M_pi;
  (((Parser *)this_01)->filepath)._M_dataplus._M_p = _Stack_68._M_p;
  (((Parser *)this_01)->filepath)._M_string_length = 0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((Parser *)this_01)->filepath)._M_string_length = (size_type)_Var3._M_pi;
  _Var3._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_58._8_8_);
    _Var3._M_pi = extraout_RDX_00;
  }
  pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this_01;
  return (ptr<Statement>)pVar6.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::continueStatement() {
    if(functionCounter == 0)
        error("Unexpected 'continue' outside a function.");

    consume();
    consume(TokenType::StatEnd, "';'");
    return make<ContinueStatement>();
}